

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

char * opus_tags_query(OpusTags *_tags,char *_tag,int _count)

{
  int iVar1;
  char **ppcVar2;
  char *_b;
  int iVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  
  sVar4 = strlen(_tag);
  if (sVar4 < 0x80000000) {
    iVar1 = _tags->comments;
    if ((long)iVar1 < 1) {
      return (char *)0x0;
    }
    ppcVar2 = _tags->user_comments;
    lVar5 = 0;
    iVar6 = 0;
    do {
      _b = ppcVar2[lVar5];
      iVar3 = op_strncasecmp(_tag,_b,(int)sVar4);
      if ((iVar3 == 0) && (_b[sVar4] == '=')) {
        if (iVar6 == _count) {
          return ppcVar2[lVar5] + sVar4 + 1;
        }
        iVar6 = iVar6 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return (char *)0x0;
}

Assistant:

const char *opus_tags_query(const OpusTags *_tags,const char *_tag,int _count){
  char   **user_comments;
  size_t   tag_len;
  int      found;
  int      ncomments;
  int      ci;
  tag_len=strlen(_tag);
  if(OP_UNLIKELY(tag_len>(size_t)INT_MAX))return NULL;
  ncomments=_tags->comments;
  user_comments=_tags->user_comments;
  found=0;
  for(ci=0;ci<ncomments;ci++){
    if(!opus_tagncompare(_tag,(int)tag_len,user_comments[ci])){
      /*We return a pointer to the data, not a copy.*/
      if(_count==found++)return user_comments[ci]+tag_len+1;
    }
  }
  /*Didn't find anything.*/
  return NULL;
}